

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O0

double __thiscall LSL_STD<UF>::Alloc(LSL_STD<UF> *this)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  int *piVar6;
  PerformanceEvaluator *perf;
  double dVar7;
  double dVar8;
  double ma_t;
  double t;
  int cols;
  int rows;
  Size local_80;
  Mat_<int> local_78;
  double local_18;
  double ls_t;
  LSL_STD<UF> *this_local;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  perf = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  ls_t = (double)this;
  local_18 = UF::Alloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) *
                       ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1) + 1,perf);
  PerformanceEvaluator::start(perf);
  cv::MatSize::operator()((MatSize *)&local_80);
  cv::Mat_<int>::Mat_(&local_78,&local_80);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_78)
  ;
  cv::Mat_<int>::~Mat_(&local_78);
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  Table2D::Reserve(&this->ER,(long)iVar1,(long)iVar2);
  Table2D::Reserve(&this->RLC,(long)(iVar1 + 1),(long)(int)(iVar2 + 1U & 0xfffffffe));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)iVar1;
  uVar5 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar5);
  this->ner = piVar6;
  Table2D::Reserve(&this->ERA,(long)iVar1,(long)(iVar2 + 1));
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  memset(*(this->ER).prows,0,(long)(iVar1 * iVar2) << 2);
  memset(*(this->RLC).prows,0,(long)(int)((iVar1 + 1) * (iVar2 + 1U & 0xfffffffe)) << 2);
  memset(this->ner,0,(long)iVar1 << 2);
  memset(*(this->ERA).prows,0,(long)(iVar1 * (iVar2 + 1)) << 2);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar7 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  memset(*(this->ER).prows,0,(long)(iVar1 * iVar2) << 2);
  memset(*(this->RLC).prows,0,(long)(int)((iVar1 + 1) * (iVar2 + 1U & 0xfffffffe)) << 2);
  memset(this->ner,0,(long)iVar1 << 2);
  memset(*(this->ERA).prows,0,(long)(iVar1 * (iVar2 + 1)) << 2);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar8 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  return local_18 + (dVar7 - dVar8);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
        // Memory allocation for the output image and for other structures
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());

        int rows = img_.rows;
        int cols = img_.cols;

        ER.Reserve(rows, cols); // Matrix of relative label (1 label/pixel)

        // Notes on the RLC table:
        // 1) rows: +1 in order to handle compact usage of RLC table without if statements,
        // 2) columns: MISSING in the paper, RLC requires 2 values/run in row, so width must be next multiple of 2.
        RLC.Reserve(rows + 1, (cols + 1) & ~1);

        ner = new int[rows]; //vector<int> ner(rows); // Number of runs 

        ERA.Reserve(rows, cols + 1); // MISSING in the paper: ERA must have one column more than the input image 
        // in order to handle special cases (e.g. lines with chessboard pattern 
        // starting with a foreground pixel) 

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(*ER.prows, 0, rows*cols * sizeof(unsigned));
        memset(*RLC.prows, 0, (rows + 1)*((cols + 1) & ~1) * sizeof(unsigned));
        memset(ner, 0, rows*sizeof(int));
        memset(*ERA.prows, 0, rows*(cols + 1) * sizeof(unsigned));
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(*ER.prows, 0, rows*cols * sizeof(unsigned));
        memset(*RLC.prows, 0, (rows + 1)*((cols + 1) & ~1) * sizeof(unsigned));
        memset(ner, 0, rows*sizeof(int));
        memset(*ERA.prows, 0, rows*(cols + 1) * sizeof(unsigned));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }